

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpGCTest_Collect_Func_Test::TestBody(InterpGCTest_Collect_Func_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Ptr func;
  Index after_new;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  Ptr local_48;
  AssertHelper local_28;
  unsigned_long local_20;
  
  InterpTest::ReadModule
            ((InterpTest *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (anonymous_namespace)::s_fac_module);
  local_48.obj_ = (DefinedFunc *)0x0;
  local_48.store_ = (Store *)0x0;
  local_48.root_index_ = 0;
  InterpTest::Instantiate((InterpTest *)this,(RefVec *)&local_48);
  if (local_48.obj_ != (DefinedFunc *)0x0) {
    operator_delete(local_48.obj_);
  }
  InterpTest::GetFuncExport(&local_48,(InterpTest *)this,0);
  local_20 = ((long)*(pointer *)
                     ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                             super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                             ._M_impl + 8) -
              (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                    super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) -
             ((long)*(pointer *)
                     ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) -
              (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_InterpGCTest).before_new + 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_58,"before_new + 3","after_new",(unsigned_long *)&local_60,&local_20);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x274,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((this->super_InterpGCTest).super_InterpTest.mod_.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot
              ((this->super_InterpGCTest).super_InterpTest.mod_.store_,
               (this->super_InterpGCTest).super_InterpTest.mod_.root_index_);
    (this->super_InterpGCTest).super_InterpTest.mod_.obj_ = (Module *)0x0;
    (this->super_InterpGCTest).super_InterpTest.mod_.store_ = (Store *)0x0;
    (this->super_InterpGCTest).super_InterpTest.mod_.root_index_ = 0;
  }
  if ((this->super_InterpGCTest).super_InterpTest.inst_.obj_ != (Instance *)0x0) {
    wabt::interp::Store::DeleteRoot
              ((this->super_InterpGCTest).super_InterpTest.inst_.store_,
               (this->super_InterpGCTest).super_InterpTest.inst_.root_index_);
    (this->super_InterpGCTest).super_InterpTest.inst_.obj_ = (Instance *)0x0;
    (this->super_InterpGCTest).super_InterpTest.inst_.store_ = (Store *)0x0;
    (this->super_InterpGCTest).super_InterpTest.inst_.root_index_ = 0;
  }
  wabt::interp::Store::Collect(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)*(pointer *)
                ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                        super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                        ._M_impl + 8) -
         (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
               super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) -
       ((long)*(pointer *)
               ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               ) -
        (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3));
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_58,"after_new","store_.object_count()",&local_20,(unsigned_long *)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x27a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48.obj_ != (DefinedFunc *)0x0) {
    wabt::interp::Store::DeleteRoot(local_48.store_,local_48.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_Func) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);  // module, instance, func.

  // Reset module and instance roots, but they'll be kept alive by the func.
  mod_.reset();
  inst_.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());
}